

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O2

int __thiscall
wigwag::detail::
signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::connect(signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
          *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>
  *psVar2;
  uint in_R8D;
  handler_attributes attributes_local;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_detail_signal_impl_hpp:78:45)>
  sg;
  
  psVar2 = (signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>
            *)CONCAT44(in_register_00000034,__fd);
  uVar1 = (*(psVar2->super_signal_connector_impl<void_()>)._vptr_signal_connector_impl[6])(psVar2);
  if ((uVar1 & 1) == 0) {
    std::recursive_mutex::lock
              ((recursive_mutex *)
               &psVar2[2].
                super_listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>
                ._handlers._root._next);
    sg._moved = false;
    sg._f.this = psVar2;
    listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
    ::
    create_node<wigwag::detail::signal_impl<void(),wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>::connect(std::shared_ptr<wigwag::task_executor>,std::function<void()>,wigwag::handler_attributes)::_lambda(wigwag::life_assurance::intrusive_life_tokens::life_checker)_1_>
              ((listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
                *)this,__fd + 8,(anon_class_32_4_c49eac36 *)(ulong)in_R8D);
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/include/wigwag/detail/signal_impl.hpp:78:45)>
    ::~scope_guard(&sg);
    return (int)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"The signal restrains connecting asynchronous handlers!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual token connect(std::shared_ptr<task_executor> worker, handler_type handler, handler_attributes attributes)
        {
            if (contains_flag(this->get_attributes(), signal_attributes::connect_sync_only))
                WIGWAG_THROW("The signal restrains connecting asynchronous handlers!");

            this->get_lock_primitive().lock_nonrecursive();
            auto sg = detail::at_scope_exit([&] { this->get_lock_primitive().unlock_nonrecursive(); } );

            return this->create_node(attributes,
                    [&](life_checker lc) {
                        async_handler<Signature_, LifeAssurancePolicy_> real_handler(std::move(worker), std::move(lc), std::move(handler));
                        if (!contains_flag(attributes, handler_attributes::suppress_populator) && this->get_handler_processor().has_populate_state())
                            this->get_exception_handler().handle_exceptions([&] { this->get_handler_processor().populate_state(real_handler); });
                        return real_handler;
                    });
        }